

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

void __thiscall Lib::List<Kernel::Unit_*>::DelIterator::del(DelIterator *this)

{
  List<Kernel::Unit_*> *pLVar1;
  List<Kernel::Unit_*> *pLVar2;
  
  pLVar2 = this->_cur;
  pLVar1 = *this->_lst;
  if (pLVar2 == pLVar1) {
    *this->_lst = pLVar1->_tail;
    List<Kernel::Unit*>::operator_delete(this->_cur,0x10);
    pLVar2 = (List<Kernel::Unit_*> *)0x0;
  }
  else {
    this->_prev->_tail = pLVar2->_tail;
    List<Kernel::Unit*>::operator_delete(pLVar2,0x10);
    pLVar2 = this->_prev;
  }
  this->_cur = pLVar2;
  return;
}

Assistant:

void del()
    {
      // we can only delete the element returned by next
      ASS_NEQ(_cur,0);
      // check that two delete requests in row did not occur
      ASS_NEQ(_cur,_prev);

      if (_cur == _lst) { // the first element must be deleted
	_lst = _lst->tail();
	delete _cur;
	_cur = 0;
	return;
      }

      ASS_NEQ(_prev,0);
      // not the first element
      _prev->setTail(_cur->tail());
      delete _cur;
      _cur = _prev;
    }